

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeometryUtil.cpp
# Opt level: O0

bool btGeometryUtil::isPointInsidePlanes
               (btAlignedObjectArray<btVector3> *planeEquations,btVector3 *point,btScalar margin)

{
  int iVar1;
  btVector3 *this;
  btScalar *pbVar2;
  btVector3 *in_RSI;
  btAlignedObjectArray<btVector3> *in_RDI;
  float in_XMM0_Da;
  btScalar bVar3;
  btScalar dist;
  btVector3 *N1;
  int i;
  int numbrushes;
  int local_24;
  
  iVar1 = btAlignedObjectArray<btVector3>::size(in_RDI);
  local_24 = 0;
  while( true ) {
    if (iVar1 <= local_24) {
      return true;
    }
    this = btAlignedObjectArray<btVector3>::operator[](in_RDI,local_24);
    bVar3 = btVector3::dot(this,in_RSI);
    pbVar2 = btVector3::operator_cast_to_float_(this);
    if (0.0 < (bVar3 + pbVar2[3]) - in_XMM0_Da) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool	btGeometryUtil::isPointInsidePlanes(const btAlignedObjectArray<btVector3>& planeEquations, const btVector3& point, btScalar	margin)
{
	int numbrushes = planeEquations.size();
	for (int i=0;i<numbrushes;i++)
	{
		const btVector3& N1 = planeEquations[i];
		btScalar dist = btScalar(N1.dot(point))+btScalar(N1[3])-margin;
		if (dist>btScalar(0.))
		{
			return false;
		}
	}
	return true;
		
}